

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::add(Dictionary *this,string *w)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int64_t *piVar3;
  int iVar4;
  pointer pcVar5;
  size_type sVar6;
  element_type *peVar7;
  int32_t iVar8;
  size_type sVar9;
  long lVar10;
  size_type sVar11;
  uint32_t h;
  string_view w_00;
  entry e;
  value_type local_80;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  pcVar5 = (w->_M_dataplus)._M_p;
  sVar6 = w->_M_string_length;
  h = 0x811c9dc5;
  if (sVar6 != 0) {
    sVar9 = 0;
    do {
      pcVar1 = pcVar5 + sVar9;
      sVar9 = sVar9 + 1;
      h = ((int)*pcVar1 ^ h) * 0x1000193;
    } while (sVar6 != sVar9);
  }
  w_00._M_str = pcVar5;
  w_00._M_len = sVar6;
  iVar8 = find(this,w_00,h);
  this->ntokens_ = this->ntokens_ + 1;
  lVar10 = (long)(this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar8];
  if (lVar10 == -1) {
    paVar2 = &local_80.word.field_2;
    local_80.word._M_string_length = 0;
    local_80.word.field_2._M_local_buf[0] = '\0';
    local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_80.word._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_assign((string *)&local_80);
    local_80.count = 1;
    local_38._M_str = (w->_M_dataplus)._M_p;
    local_38._M_len = w->_M_string_length;
    peVar7 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find
                       (&local_38,(peVar7->label)._M_dataplus._M_p,0,
                        (peVar7->label)._M_string_length);
    local_80.type = sVar11 == 0;
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back
              (&this->words_,&local_80);
    iVar4 = this->size_;
    this->size_ = iVar4 + 1;
    (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar8] = iVar4;
    if (local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.word._M_dataplus._M_p != paVar2) {
      operator_delete(local_80.word._M_dataplus._M_p,
                      CONCAT71(local_80.word.field_2._M_allocated_capacity._1_7_,
                               local_80.word.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    piVar3 = &(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar10].count;
    *piVar3 = *piVar3 + 1;
  }
  return;
}

Assistant:

void Dictionary::add(const std::string& w) {
  int32_t h = find(w);
  ntokens_++;
  if (word2int_[h] == -1) {
    entry e;
    e.word = w;
    e.count = 1;
    e.type = getType(w);
    words_.push_back(e);
    word2int_[h] = size_++;
  } else {
    words_[word2int_[h]].count++;
  }
}